

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O1

future<std::vector<int,_std::allocator<int>_>_> * __thiscall
mxx::comm::irecv_vec<int,std::allocator<int>>
          (future<std::vector<int,_std::allocator<int>_>_> *__return_storage_ptr__,comm *this,
          size_t size,int src,int tag)

{
  pointer piVar1;
  MPI_Comm poVar2;
  MPI_Datatype poVar3;
  MPI_Request *ppoVar4;
  datatype dt;
  future_builder<std::vector<int,_std::allocator<int>_>_> f;
  datatype local_a0;
  uint local_88 [2];
  future<std::vector<int,_std::allocator<int>_>_> local_80;
  datatype local_48;
  
  if ((src < 0) || (this->m_size <= src)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,local_88);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_88[0],
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/comm_fwd.hpp"
           ,0x252,"irecv_vec","0 <= src && src < this->size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  local_88[0] = CONCAT31(local_88[0]._1_3_,1);
  future<std::vector<int,_std::allocator<int>_>_>::future(&local_80);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             local_80.m_data._M_t.
             super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
             .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl,
             size);
  if (size < 0x7fffffff) {
    local_a0._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
    local_a0.mpitype = (MPI_Datatype)&ompi_mpi_int;
    local_a0.builtin = true;
    piVar1 = (((_Vector_base<int,_std::allocator<int>_> *)
              local_80.m_data._M_t.
              super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
              .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl)
             ->_M_impl).super__Vector_impl_data._M_start;
    poVar2 = this->mpi_comm;
    ppoVar4 = requests::add(&local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>.
                             m_req);
    MPI_Irecv(piVar1,size & 0xffffffff,&ompi_mpi_int,src,tag,poVar2,ppoVar4);
  }
  else {
    local_48._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
    local_48.mpitype = (MPI_Datatype)&ompi_mpi_int;
    local_48.builtin = true;
    datatype::contiguous(&local_a0,&local_48,size);
    datatype::~datatype(&local_48);
    poVar3 = local_a0.mpitype;
    piVar1 = (((_Vector_base<int,_std::allocator<int>_> *)
              local_80.m_data._M_t.
              super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
              .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl)
             ->_M_impl).super__Vector_impl_data._M_start;
    poVar2 = this->mpi_comm;
    ppoVar4 = requests::add(&local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>.
                             m_req);
    MPI_Irecv(piVar1,1,poVar3,src,tag,poVar2,ppoVar4);
  }
  datatype::~datatype(&local_a0);
  local_88[0] = local_88[0] & 0xffffff00;
  (__return_storage_ptr__->super_future_base<std::vector<int,_std::allocator<int>_>_>).
  _vptr_future_base = (_func_int **)&PTR__future_base_001a6c40;
  (__return_storage_ptr__->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_valid =
       local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>.m_valid;
  (__return_storage_ptr__->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_ever_valid
       = local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>.m_ever_valid;
  (__return_storage_ptr__->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_req.
  _vptr_requests = (_func_int **)&PTR__requests_001a5d90;
  (__return_storage_ptr__->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_req.
  m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>.m_req.m_requests.
       super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_req.
  m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>.m_req.m_requests.
       super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_req.
  m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>.m_req.m_requests.
       super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>.m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>.m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>.m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_future_base<std::vector<int,_std::allocator<int>_>_>).
  _vptr_future_base = (_func_int **)&PTR__future_001a6bf8;
  (__return_storage_ptr__->m_data)._M_t.
  super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
  .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl =
       (vector<int,_std::allocator<int>_> *)
       local_80.m_data._M_t.
       super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
       .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl;
  local_80.m_data._M_t.
  super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
  .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
          )0x0;
  local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>._vptr_future_base =
       (_func_int **)&PTR__future_001a6bf8;
  impl::future_base<std::vector<int,_std::allocator<int>_>_>::~future_base
            (&local_80.super_future_base<std::vector<int,_std::allocator<int>_>_>);
  return __return_storage_ptr__;
}

Assistant:

inline mxx::future<std::vector<T, Alloc> > comm::irecv_vec(size_t size, int src, int tag) const {
    MXX_ASSERT(0 <= src && src < this->size());
    mxx::future_builder<std::vector<T, Alloc> > f;
    f.data()->resize(size);
    if (size < mxx::max_int) {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Irecv(&(f.data()->front()), size, dt.type(), src, tag, this->mpi_comm, &f.add_request());
    } else {
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
        MPI_Irecv(&(f.data()->front()), 1, dt.type(), src, tag, this->mpi_comm, &f.add_request());
    }
    return f.get_future();
}